

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::added2Set(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,
           SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *addset,int n)

{
  int iVar1;
  uint uVar2;
  Item *pIVar3;
  DataKey *pDVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  DataArray<int> moreArray;
  DataArray<int> local_48;
  
  if (n != 0) {
    DataArray<int>::DataArray(&local_48,(set->set).thenum,0,1.2);
    for (uVar8 = (ulong)(uint)(set->set).thenum; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
      local_48.data[uVar8 - 1] = 0;
    }
    iVar7 = (addset->set).thenum;
    pIVar3 = (addset->set).theitem;
    pDVar4 = (addset->set).thekey;
    iVar9 = 0;
    for (lVar10 = (long)(iVar7 - n); lVar10 < iVar7; lVar10 = lVar10 + 1) {
      iVar1 = pDVar4[lVar10].idx;
      uVar2 = pIVar3[iVar1].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused;
      lVar11 = (ulong)uVar2 * 0x3c + -4;
      for (uVar12 = uVar2; 0 < (int)uVar12; uVar12 = uVar12 - 1) {
        local_48.data
        [*(int *)((long)&((pIVar3[iVar1].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem)->val).m_backend.data + lVar11)] =
             local_48.data
             [*(int *)((long)&((pIVar3[iVar1].data.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val).m_backend.data + lVar11)] + 1;
        lVar11 = lVar11 + -0x3c;
      }
      iVar9 = iVar9 + uVar2;
    }
    if ((set->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ).themax < iVar9) {
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::memRemax(set,iVar9);
    }
    for (uVar8 = (ulong)(uint)(set->set).thenum; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
      pIVar3 = (set->set).theitem;
      iVar7 = (set->set).thekey[uVar8 - 1].idx;
      iVar9 = pIVar3[iVar7].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused;
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::xtend(set,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pIVar3 + iVar7),local_48.data[uVar8 - 1] + iVar9);
      (set->set).theitem[(set->set).thekey[uVar8 - 1].idx].data.
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .memused = local_48.data[uVar8 - 1] + iVar9;
      local_48.data[uVar8 - 1] = iVar9;
    }
    iVar7 = (addset->set).thenum;
    for (lVar10 = (long)(iVar7 - n); lVar10 < iVar7; lVar10 = lVar10 + 1) {
      pIVar3 = (addset->set).theitem;
      iVar7 = (addset->set).thekey[lVar10].idx;
      uVar8 = (ulong)(uint)pIVar3[iVar7].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
      lVar11 = uVar8 * 0x3c;
      while( true ) {
        if ((int)uVar8 < 1) break;
        pNVar5 = pIVar3[iVar7].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        iVar9 = *(int *)((long)(&pNVar5[-1].val + 1) + lVar11);
        iVar1 = local_48.data[iVar9];
        local_48.data[iVar9] = iVar1 + 1;
        pNVar6 = (set->set).theitem[(set->set).thekey[iVar9].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pNVar6[iVar1].idx = (int)lVar10;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(pNVar6 + iVar1),
                   (cpp_dec_float<50U,_int,_void> *)((long)&pNVar5[-1].val.m_backend.data + lVar11))
        ;
        uVar8 = (ulong)((int)uVar8 - 1);
        lVar11 = lVar11 + -0x3c;
      }
      iVar7 = (addset->set).thenum;
    }
    DataArray<int>::~DataArray(&local_48);
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }